

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

int __thiscall QAbstractAnimation::totalDuration(QAbstractAnimation *this)

{
  int iVar1;
  QAbstractAnimation *in_RDI;
  int loopcount;
  int dura;
  int local_4;
  
  local_4 = (*(in_RDI->super_QObject)._vptr_QObject[0xc])();
  if (0 < local_4) {
    iVar1 = loopCount(in_RDI);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      local_4 = local_4 * iVar1;
    }
  }
  return local_4;
}

Assistant:

int QAbstractAnimation::totalDuration() const
{
    int dura = duration();
    if (dura <= 0)
        return dura;
    int loopcount = loopCount();
    if (loopcount < 0)
        return -1;
    return dura * loopcount;
}